

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

HANDLE CreateFileMappingW(HANDLE hFile,LPSECURITY_ATTRIBUTES lpFileMappingAttributes,DWORD flProtect
                         ,DWORD dwMaximumSizeHigh,DWORD dwMaximumSizeLow,LPCWSTR lpName)

{
  PAL_ERROR dwLastError;
  CPalThread *pThread_00;
  PAL_ERROR palError;
  CPalThread *pThread;
  HANDLE hFileMapping;
  LPCWSTR lpName_local;
  DWORD local_20;
  DWORD dwMaximumSizeLow_local;
  DWORD dwMaximumSizeHigh_local;
  DWORD flProtect_local;
  LPSECURITY_ATTRIBUTES lpFileMappingAttributes_local;
  HANDLE hFile_local;
  
  pThread = (CPalThread *)0x0;
  hFileMapping = lpName;
  lpName_local._4_4_ = dwMaximumSizeLow;
  local_20 = dwMaximumSizeHigh;
  dwMaximumSizeLow_local = flProtect;
  _dwMaximumSizeHigh_local = lpFileMappingAttributes;
  lpFileMappingAttributes_local = (LPSECURITY_ATTRIBUTES)hFile;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalCreateFileMapping
                          (pThread_00,lpFileMappingAttributes_local,_dwMaximumSizeHigh_local,
                           dwMaximumSizeLow_local,local_20,lpName_local._4_4_,(LPCWSTR)hFileMapping,
                           &pThread);
  CorUnix::CPalThread::SetLastError(dwLastError);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pThread;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateFileMappingW(
               IN HANDLE hFile,
               IN LPSECURITY_ATTRIBUTES lpFileMappingAttributes,
               IN DWORD flProtect,
               IN DWORD dwMaximumSizeHigh,
               IN DWORD dwMaximumSizeLow,
               IN LPCWSTR lpName)
{
    HANDLE hFileMapping = NULL;
    CPalThread *pThread = NULL;
    PAL_ERROR palError = NO_ERROR;
    
    PERF_ENTRY(CreateFileMappingW);
    ENTRY("CreateFileMappingW(hFile=%p, lpAttributes=%p, flProtect=%#x, "
          "dwMaxSizeH=%u, dwMaxSizeL=%u, lpName=%p (%S))\n",
          hFile, lpFileMappingAttributes, flProtect, dwMaximumSizeHigh, 
          dwMaximumSizeLow, lpName?lpName:W16_NULLSTRING, lpName?lpName:W16_NULLSTRING);

    pThread = InternalGetCurrentThread();

    palError = InternalCreateFileMapping(
        pThread,
        hFile,
        lpFileMappingAttributes,
        flProtect,
        dwMaximumSizeHigh,
        dwMaximumSizeLow,
        lpName,
        &hFileMapping
        );

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pThread->SetLastError(palError);

    LOGEXIT( "CreateFileMappingW returning %p .\n", hFileMapping );
    PERF_EXIT(CreateFileMappingW);
    return hFileMapping;
}